

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::sr::anon_unknown_0::ShaderMatrixCase::createInstance(ShaderMatrixCase *this,Context *context)

{
  bool bVar1;
  ShaderMatrixInstance *this_00;
  ShaderEvaluator *evaluator;
  Context *context_local;
  ShaderMatrixCase *this_local;
  
  this_00 = (ShaderMatrixInstance *)operator_new(0x230);
  bVar1 = (this->super_ShaderRenderCase).m_isVertexCase;
  evaluator = de::details::
              UniqueBase<const_vkt::sr::ShaderEvaluator,_de::DefaultDeleter<const_vkt::sr::ShaderEvaluator>_>
              ::operator*(&(this->super_ShaderRenderCase).m_evaluator.
                           super_UniqueBase<const_vkt::sr::ShaderEvaluator,_de::DefaultDeleter<const_vkt::sr::ShaderEvaluator>_>
                         );
  ShaderMatrixInstance::ShaderMatrixInstance
            (this_00,context,(bool)(bVar1 & 1),evaluator,this->m_in0,this->m_in1,this->m_op);
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* ShaderMatrixCase::createInstance (Context& context) const
{
	return new ShaderMatrixInstance(context, m_isVertexCase, *m_evaluator, m_in0, m_in1, m_op);
}